

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O0

int is_C_identifier(char *name)

{
  ushort uVar1;
  char *pcVar2;
  int iVar3;
  ushort **ppuVar4;
  int c;
  char *s;
  char *name_local;
  
  iVar3 = (int)*name;
  if (iVar3 == 0x22) {
    iVar3 = (int)name[1];
    ppuVar4 = __ctype_b_loc();
    uVar1 = (*ppuVar4)[iVar3] & 0x400;
    pcVar2 = name + 1;
    while (((uVar1 != 0 || (iVar3 == 0x5f)) || (iVar3 == 0x24))) {
      iVar3 = (int)pcVar2[1];
      if (iVar3 == 0x22) {
        return 1;
      }
      ppuVar4 = __ctype_b_loc();
      uVar1 = (*ppuVar4)[iVar3] & 8;
      pcVar2 = pcVar2 + 1;
    }
  }
  else {
    ppuVar4 = __ctype_b_loc();
    uVar1 = (*ppuVar4)[iVar3] & 0x400;
    while (((uVar1 != 0 || (iVar3 == 0x5f)) || (iVar3 == 0x24))) {
      iVar3 = (int)name[1];
      if (iVar3 == 0) {
        return 1;
      }
      ppuVar4 = __ctype_b_loc();
      uVar1 = (*ppuVar4)[iVar3] & 8;
      name = name + 1;
    }
  }
  return 0;
}

Assistant:

int is_C_identifier(char *name)
{
    register char *s;
    register int c;

    s = name;
    c = *s;
    if (c == '"')
    {
	c = *++s;
	if (!isalpha(c) && c != '_' && c != '$')
	    return (0);
	while ((c = *++s) != '"')
	{
	    if (!isalnum(c) && c != '_' && c != '$')
		return (0);
	}
	return (1);
    }

    if (!isalpha(c) && c != '_' && c != '$')
	return (0);
    while ((c = *++s))
    {
	if (!isalnum(c) && c != '_' && c != '$')
	    return (0);
    }
    return (1);
}